

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_level_stats.h
# Opt level: O1

void __thiscall vp9_parser::Vp9LevelStats::Vp9LevelStats(Vp9LevelStats *this)

{
  deque<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *pdVar1;
  _Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *p_Var2;
  
  this->frames = 0;
  this->displayed_frames = 0;
  *(undefined4 *)&this->start_ns_ = 0xffffffff;
  *(undefined4 *)((long)&this->start_ns_ + 4) = 0xffffffff;
  *(undefined4 *)&this->end_ns_ = 0xffffffff;
  *(undefined4 *)((long)&this->end_ns_ + 4) = 0xffffffff;
  this->duration_ns_ = -1;
  this->max_luma_picture_size_ = 0;
  this->max_luma_picture_breadth_ = 0;
  pdVar1 = &(this->luma_window_).c;
  (pdVar1->super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (pdVar1->super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  p_Var2 = &(this->luma_window_).c.
            super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  p_Var2 = &(this->luma_window_).c.
            super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  p_Var2 = &(this->luma_window_).c.
            super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  p_Var2 = &(this->luma_window_).c.
            super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
  _M_initialize_map((_Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                    &this->luma_window_,0);
  this->max_luma_end_ns_ = 0;
  this->current_luma_size_ = 0;
  this->max_luma_size_ = 0;
  this->max_luma_sample_rate_grace_percent_ = 1.5;
  this->first_altref = true;
  this->frames_since_last_altref = 0;
  this->minimum_altref_distance = 0x7fffffff;
  this->min_altref_end_ns = 0;
  (this->cpb_window_).c.
  super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  pdVar1 = &(this->cpb_window_).c;
  (pdVar1->super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (pdVar1->super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  p_Var2 = &(this->cpb_window_).c.
            super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  *(undefined1 (*) [16])
   &(this->cpb_window_).c.
    super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (undefined1  [16])0x0;
  p_Var2 = &(this->cpb_window_).c.
            super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->cpb_window_).c.
  super__Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
  _M_initialize_map((_Deque_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                    &this->cpb_window_,0);
  *(undefined1 (*) [16])((long)&this->total_uncompressed_bits_ + 4) = (undefined1  [16])0x0;
  this->total_compressed_size_ = 0;
  this->total_uncompressed_bits_ = 0;
  this->max_cpb_start_ns_ = 0;
  this->max_cpb_end_ns_ = 0;
  this->current_cpb_size_ = 0;
  this->max_cpb_size_ = 0;
  this->max_cpb_window_size_ = 0;
  this->max_cpb_window_end_ns_ = 0;
  this->estimate_last_frame_duration_ = true;
  return;
}

Assistant:

Vp9LevelStats()
      : frames(0),
        displayed_frames(0),
        start_ns_(-1),
        end_ns_(-1),
        duration_ns_(-1),
        max_luma_picture_size_(0),
        max_luma_picture_breadth_(0),
        current_luma_size_(0),
        max_luma_size_(0),
        max_luma_end_ns_(0),
        max_luma_sample_rate_grace_percent_(1.5),
        first_altref(true),
        frames_since_last_altref(0),
        minimum_altref_distance(std::numeric_limits<int>::max()),
        min_altref_end_ns(0),
        max_cpb_window_size_(0),
        max_cpb_window_end_ns_(0),
        current_cpb_size_(0),
        max_cpb_size_(0),
        max_cpb_start_ns_(0),
        max_cpb_end_ns_(0),
        total_compressed_size_(0),
        total_uncompressed_bits_(0),
        frames_refreshed_(0),
        max_frames_refreshed_(0),
        max_column_tiles_(0),
        estimate_last_frame_duration_(true) {}